

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

bool __thiscall
crnlib::mipmapped_texture::read_from_file
          (mipmapped_texture *this,char *pFilename,format file_format)

{
  bool bVar1;
  int iVar2;
  data_stream_serializer serializer;
  cfile_stream in_stream;
  
  clear(this);
  dynamic_string::operator=(&this->m_last_error,"Can\'t open file");
  cfile_stream::cfile_stream(&in_stream);
  iVar2 = cfile_stream::open(&in_stream,pFilename,5,0);
  if ((char)iVar2 == '\0') {
    bVar1 = false;
  }
  else {
    serializer.m_little_endian = true;
    serializer.m_pStream = &in_stream.super_data_stream;
    bVar1 = read_from_stream(this,&serializer,file_format);
  }
  cfile_stream::~cfile_stream(&in_stream);
  return bVar1;
}

Assistant:

bool mipmapped_texture::read_from_file(const char* pFilename, texture_file_types::format file_format) {
  clear();

  set_last_error("Can't open file");

  bool success = false;

  cfile_stream in_stream;
  if (in_stream.open(pFilename)) {
    data_stream_serializer serializer(in_stream);
    success = read_from_stream(serializer, file_format);
  }

  return success;
}